

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O1

Result __thiscall
tonk::SessionOutgoing::QueueReliable
          (SessionOutgoing *this,uint messageType,uint8_t *data,size_t bytes)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  long *plVar5;
  _func_int **pp_Var6;
  long *plVar7;
  Result *success;
  undefined4 in_register_00000034;
  long lVar8;
  ulong in_R8;
  long lVar9;
  ulong uVar10;
  char cVar11;
  long *local_70;
  long local_60;
  long lStack_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  lVar8 = CONCAT44(in_register_00000034,messageType);
  if (in_R8 < 0xfa01) {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)(lVar8 + 0x238));
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    lVar9 = lVar8 + 0x78;
    if ((uint)data < 0x12) {
      lVar9 = lVar8 + 0x50;
    }
    do {
      sVar4 = OutgoingQueue::AppendSplitReliable
                        ((OutgoingQueue *)(lVar9 + 0x318),(uint)data,(uint8_t *)bytes,in_R8);
      cVar11 = '\x02';
      uVar10 = in_R8 - sVar4;
      if (sVar4 <= in_R8 && uVar10 != 0) {
        OutgoingQueue::PushAndGetFreshBuffer((OutgoingQueue *)this);
        bytes = bytes + sVar4;
        cVar11 = (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing != (_func_int **)0x0;
        in_R8 = uVar10;
        if (!(bool)cVar11) {
          Result::~Result((Result *)this);
        }
      }
    } while (cVar11 == '\0');
    if (cVar11 == '\x02') {
      (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(lVar8 + 0x238));
  }
  else {
    uVar10 = in_R8;
    cVar11 = '\x04';
    do {
      cVar2 = cVar11;
      if (uVar10 < 100) {
        cVar2 = cVar2 + -2;
        goto LAB_0014d882;
      }
      if (uVar10 < 1000) {
        cVar2 = cVar2 + -1;
        goto LAB_0014d882;
      }
      if (uVar10 < 10000) goto LAB_0014d882;
      bVar1 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar11 = cVar2 + '\x04';
    } while (bVar1);
    cVar2 = cVar2 + '\x01';
LAB_0014d882:
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar2);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,in_R8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar5;
    }
    lVar8 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pp_Var6 = (_func_int **)operator_new(0x38);
    *pp_Var6 = (_func_int *)"SessionOutgoing::QueueReliableMessage";
    pp_Var6[1] = (_func_int *)(pp_Var6 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pp_Var6 + 1),local_70,lVar8 + (long)local_70);
    *(undefined4 *)(pp_Var6 + 5) = 0;
    pp_Var6[6] = (_func_int *)0x5;
    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var6;
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::QueueReliable(
    unsigned messageType,
    const uint8_t* data,
    size_t bytes)
{
    // Note: Compressed type is generated internally by Flush()
    TONK_DEBUG_ASSERT(messageType > protocol::MessageType_Compressed);
    // Control/Unordered must be queued via QueueControl()/QueueUnordered()
    TONK_DEBUG_ASSERT(messageType < protocol::MessageType_Control);

    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    // Check for oversized messages without any additions up front to avoid
    // integer overflow issues
    if (bytes > TONK_MAX_RELIABLE_BYTES)
    {
        return Result("SessionOutgoing::QueueReliableMessage",
            std::to_string(bytes) + " byte message too large",
            ErrorType::Tonk,
            Tonk_MessageTooLarge);
    }

    const unsigned queueIndex = (messageType >= protocol::MessageType_LowPri)
        ? Queue_LowPri : Queue_Reliable;

    Locker locker(OutgoingQueueLock);

    OutgoingQueue* queue = &Queues[queueIndex];

    for (;;)
    {
        // Attempt to append message to OutBuffer
        const size_t written = queue->AppendSplitReliable(messageType, data, bytes);
        TONK_DEBUG_ASSERT(written <= bytes);
        if (written >= bytes) {
            break; // Done
        }

        data += written, bytes -= written;

        // Push the OutBuffer to the send queue and start a new OutBuffer
        const Result result = queue->PushAndGetFreshBuffer();
        if (result.IsFail()) {
            TONK_DEBUG_BREAK();
            return result;
        }
    }

    return Result::Success();
}